

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Op __thiscall spv::Builder::getMostBasicTypeClass(Builder *this,Id typeId)

{
  uint uVar1;
  Op OVar2;
  Instruction *this_00;
  Id IVar3;
  ulong uVar4;
  
  uVar4 = (ulong)typeId;
  while( true ) {
    this_00 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4];
    OVar2 = this_00->opCode;
    uVar1 = OVar2 - OpTypeVector;
    if ((9 < uVar1) || ((0x263U >> (uVar1 & 0x1f) & 1) == 0)) break;
    IVar3 = Instruction::getIdOperand(this_00,*(int *)(&DAT_0073ae9c + (ulong)uVar1 * 4));
    uVar4 = (ulong)IVar3;
  }
  return OVar2;
}

Assistant:

Op Builder::getMostBasicTypeClass(Id typeId) const
{
    Instruction* instr = module.getInstruction(typeId);

    Op typeClass = instr->getOpCode();
    switch (typeClass)
    {
    case OpTypeVector:
    case OpTypeMatrix:
    case OpTypeArray:
    case OpTypeRuntimeArray:
        return getMostBasicTypeClass(instr->getIdOperand(0));
    case OpTypePointer:
        return getMostBasicTypeClass(instr->getIdOperand(1));
    default:
        return typeClass;
    }
}